

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_struct
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Structures may not have an atomic_uint variable.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iterateShaders(ctx,TESTCASE_STRUCT);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_struct (NegativeTestContext& ctx)
{
	ctx.beginSection("Structures may not have an atomic_uint variable.");
	iterateShaders(ctx, TESTCASE_STRUCT);
	ctx.endSection();
}